

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O3

Extra_UnateInfo_t * Extra_UnateComputeSlow(DdManager *dd,DdNode *bFunc)

{
  int iVar1;
  int iVar2;
  DdNode *n;
  Extra_UnateInfo_t *pEVar3;
  Extra_UnateVar_t *pEVar4;
  Extra_UnateVar_t EVar5;
  uint uVar6;
  DdNode *pDVar7;
  
  n = Cudd_Support(dd,bFunc);
  Cudd_Ref(n);
  iVar1 = Extra_bddSuppSize(dd,n);
  pEVar3 = (Extra_UnateInfo_t *)calloc(1,0x18);
  pEVar3->nVars = iVar1;
  pEVar4 = (Extra_UnateVar_t *)calloc(1,(long)iVar1 << 2);
  pEVar3->pVars = pEVar4;
  pEVar3->nVarsMax = dd->size;
  if (n != dd->one) {
    iVar1 = 0;
    pDVar7 = n;
    do {
      iVar2 = Extra_bddCheckUnateNaive(dd,bFunc,pDVar7->index);
      EVar5 = (Extra_UnateVar_t)((uint)*pEVar4 & 0xc0000000 | pDVar7->index & 0x3fffffff);
      *pEVar4 = EVar5;
      if (iVar2 == -1) {
        uVar6 = 0x80000000;
LAB_008268eb:
        *pEVar4 = (Extra_UnateVar_t)((uint)EVar5 | uVar6);
      }
      else if (iVar2 == 1) {
        uVar6 = 0x40000000;
        goto LAB_008268eb;
      }
      iVar1 = (iVar1 + 1) - (uint)(iVar2 == 0);
      pEVar3->nUnate = iVar1;
      pDVar7 = (pDVar7->type).kids.T;
      pEVar4 = pEVar4 + 1;
    } while (pDVar7 != dd->one);
  }
  Cudd_RecursiveDeref(dd,n);
  return pEVar3;
}

Assistant:

Extra_UnateInfo_t * Extra_UnateComputeSlow( DdManager * dd, DdNode * bFunc )
{
    int nSuppSize;
    DdNode * bSupp, * bTemp;
    Extra_UnateInfo_t * p;
    int i, Res;

    // compute the support
    bSupp = Cudd_Support( dd, bFunc );   Cudd_Ref( bSupp );
    nSuppSize = Extra_bddSuppSize( dd, bSupp );
//printf( "Support = %d. ", nSuppSize );
//Extra_bddPrint( dd, bSupp );
//printf( "%d ", nSuppSize );

    // allocate the storage for symmetry info
    p = Extra_UnateInfoAllocate( nSuppSize );

    // assign the variables
    p->nVarsMax = dd->size;
    for ( i = 0, bTemp = bSupp; bTemp != b1; bTemp = cuddT(bTemp), i++ )
    {
        Res = Extra_bddCheckUnateNaive( dd, bFunc, bTemp->index );
        p->pVars[i].iVar = bTemp->index;
        if ( Res == -1 )
            p->pVars[i].Neg = 1;
        else if ( Res == 1 )
            p->pVars[i].Pos = 1;
        p->nUnate += (Res != 0);
    }
    Cudd_RecursiveDeref( dd, bSupp );
    return p;

}